

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303DLHC::setCompassCRB(RTIMUGD20HM303DLHC *this)

{
  bool bVar1;
  uchar local_19;
  uchar crb;
  RTIMUGD20HM303DLHC *this_local;
  
  switch(((this->super_RTIMU).m_settings)->m_GD20HM303DLHCCompassFsr) {
  case 1:
    local_19 = ' ';
    this->m_compassScaleXY = 0.09090909;
    this->m_compassScaleZ = 0.10204082;
    break;
  case 2:
    local_19 = '@';
    this->m_compassScaleXY = 0.116959065;
    this->m_compassScaleZ = 0.13157895;
    break;
  case 3:
    local_19 = '`';
    this->m_compassScaleXY = 0.14925373;
    this->m_compassScaleZ = 0.16666667;
    break;
  case 4:
    local_19 = 0x80;
    this->m_compassScaleXY = 0.22222222;
    this->m_compassScaleZ = 0.25;
    break;
  case 5:
    local_19 = 0xa0;
    this->m_compassScaleXY = 0.25;
    this->m_compassScaleZ = 0.28169015;
    break;
  case 6:
    local_19 = 0xc0;
    this->m_compassScaleXY = 0.3030303;
    this->m_compassScaleZ = 0.33898306;
    break;
  case 7:
    local_19 = 0xe0;
    this->m_compassScaleXY = 0.4347826;
    this->m_compassScaleZ = 0.4878049;
    break;
  default:
    fprintf(_stderr,"Illegal LSM303DLHC compass FSR code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DLHCCompassFsr);
    return false;
  }
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                             this->m_compassSlaveAddr,'\x01',local_19,
                             "Failed to set LSM303DLHC CRB_M");
  return bVar1;
}

Assistant:

bool RTIMUGD20HM303DLHC::setCompassCRB()
{
    unsigned char crb;

    //  convert FSR to uT

    switch (m_settings->m_GD20HM303DLHCCompassFsr) {
    case LSM303DLHC_COMPASS_FSR_1_3:
        crb = 0x20;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)1100;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)980;
        break;

    case LSM303DLHC_COMPASS_FSR_1_9:
        crb = 0x40;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)855;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)760;
       break;

    case LSM303DLHC_COMPASS_FSR_2_5:
        crb = 0x60;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)670;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)600;
        break;

    case LSM303DLHC_COMPASS_FSR_4:
        crb = 0x80;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)450;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)400;
        break;

    case LSM303DLHC_COMPASS_FSR_4_7:
        crb = 0xa0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)400;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)355;
        break;

    case LSM303DLHC_COMPASS_FSR_5_6:
        crb = 0xc0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)330;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)295;
        break;

    case LSM303DLHC_COMPASS_FSR_8_1:
        crb = 0xe0;
        m_compassScaleXY = (RTFLOAT)100 / (RTFLOAT)230;
        m_compassScaleZ = (RTFLOAT)100 / (RTFLOAT)205;
        break;

    default:
        HAL_ERROR1("Illegal LSM303DLHC compass FSR code %d\n", m_settings->m_GD20HM303DLHCCompassFsr);
        return false;
    }

    return m_settings->HALWrite(m_compassSlaveAddr,  LSM303DLHC_CRB_M, crb, "Failed to set LSM303DLHC CRB_M");
}